

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.h
# Opt level: O2

void __thiscall
xray_re::xr_ini_writer::
w_ini_seq<std::vector<xray_re::_vector3<float>,std::allocator<xray_re::_vector3<float>>>>
          (xr_ini_writer *this,
          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *container,
          char *prefix)

{
  pointer p_Var1;
  int iVar2;
  char *__n;
  void *__buf;
  uint32_t id;
  uint uVar3;
  pointer p_Var4;
  char buf [1024];
  char acStack_438 [1032];
  
  p_Var1 = (container->
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (p_Var4 = (container->
                super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start; p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    __n = prefix;
    iVar2 = snprintf(acStack_438,0x400,"%s_%04d",prefix,(ulong)uVar3);
    if (0 < iVar2) {
      write(this,(int)acStack_438,__buf,(size_t)__n);
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

inline void xr_ini_writer::w_ini_seq(const T& container, const char* prefix)
{
	char buf[1024];

	typename T::const_iterator it = container.begin(), end = container.end();
	for (uint32_t id = 0; it != end; ++it) {
#if defined(_MSC_VER) && _MSC_VER >= 1400
		int n = sprintf_s(buf, sizeof(buf), "%s_%04d", prefix, id);
#else
		int n = snprintf(buf, sizeof(buf), "%s_%04d", prefix, id);
#endif
		if (n > 0)
			write(buf, *it);
		id++;
	}
}